

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

double fmod_one(double x)

{
  long lVar1;
  double dVar2;
  
  lVar1 = lrint(x);
  dVar2 = x - (double)lVar1;
  return (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar2 |
                 (ulong)(dVar2 + 1.0) & -(ulong)(dVar2 < 0.0));
}

Assistant:

static inline double
fmod_one (double x)
{	double res ;

	res = x - lrint (x) ;
	if (res < 0.0)
		return res + 1.0 ;

	return res ;
}